

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::MILSpec::DictionaryValue_KeyValuePair::~DictionaryValue_KeyValuePair
          (DictionaryValue_KeyValuePair *this)

{
  ~DictionaryValue_KeyValuePair(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

DictionaryValue_KeyValuePair::~DictionaryValue_KeyValuePair() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.MILSpec.DictionaryValue.KeyValuePair)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}